

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O0

int wiz_map(void)

{
  uint uVar1;
  uint uVar2;
  long save_Hhallu;
  long save_Hconf;
  trap *t;
  
  uVar2 = u.uprops[0x23].intrinsic;
  uVar1 = u.uprops[0x1c].intrinsic;
  if (flags.debug == '\0') {
    pline("Unavailable command \'^F\'.");
  }
  else {
    u.uprops[0x23].intrinsic = 0;
    u.uprops[0x1c].intrinsic = 0;
    for (save_Hconf = (long)level->lev_traps; save_Hconf != 0; save_Hconf = *(long *)save_Hconf) {
      *(byte *)(save_Hconf + 8) = *(byte *)(save_Hconf + 8) & 0xdf | 0x20;
      map_trap((trap *)save_Hconf,1);
    }
    do_mapping();
    u.uprops[0x1c].intrinsic = uVar1;
    u.uprops[0x23].intrinsic = uVar2;
  }
  return 0;
}

Assistant:

static int wiz_map(void)
{
	if (wizard) {
	    struct trap *t;
	    long save_Hconf = HConfusion,
		 save_Hhallu = HHallucination;

	    HConfusion = HHallucination = 0L;
	    for (t = level->lev_traps; t != 0; t = t->ntrap) {
		t->tseen = 1;
		map_trap(t, TRUE);
	    }
	    do_mapping();
	    HConfusion = save_Hconf;
	    HHallucination = save_Hhallu;
	} else
	    pline("Unavailable command '^F'.");
	return 0;
}